

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

bool __thiscall ON_wString::Insert(ON_wString *this,int index,wchar_t ch,int insert_count)

{
  size_t array_capacity;
  uint uVar1;
  ulong uVar2;
  ON_Internal_Empty_wString *pOVar3;
  wchar_t *__src;
  ulong uVar4;
  bool bVar5;
  
  if (ch == L'\0' || (insert_count | index) < 0) {
    bVar5 = false;
  }
  else {
    pOVar3 = (ON_Internal_Empty_wString *)(this->m_s + -3);
    if (this->m_s == (wchar_t *)0x0) {
      pOVar3 = &empty_wstring;
    }
    uVar1 = (pOVar3->header).string_length;
    bVar5 = (uint)index <= uVar1;
    if (bVar5) {
      uVar4 = (ulong)(uint)insert_count;
      array_capacity = (long)(int)uVar1 + uVar4;
      ReserveArray(this,array_capacity);
      __src = this->m_s + (uint)index;
      memmove(__src + uVar4,__src,((long)(int)uVar1 - (ulong)(uint)index) * 4 + 4);
      if (0 < insert_count) {
        uVar2 = 0;
        do {
          __src[uVar2] = ch;
          uVar2 = uVar2 + 1;
        } while (uVar4 != uVar2);
      }
      pOVar3 = (ON_Internal_Empty_wString *)(this->m_s + -3);
      if (this->m_s == (wchar_t *)0x0) {
        pOVar3 = &empty_wstring;
      }
      (pOVar3->header).string_length = (int)array_capacity;
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool ON_wString::Insert(int index, wchar_t ch, int insert_count)
{
  if ((index < 0) || (insert_count < 0) || (ch == 0))
    return false;

  const auto length = size_t(Header()->string_length);
  if (index > length)
    return false;

  const auto new_length = length + insert_count;
  ReserveArray(new_length);

  auto* p = m_s + index;
  const auto move_bytes = (length - index + 1) * sizeof(wchar_t);
  memmove(p + insert_count, p, move_bytes);

  for (int i = 0; i < insert_count; i++)
  {
    p[i] = ch;
  }

  Header()->string_length = int(new_length);

  return true;
}